

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O2

void __thiscall Farm::createTruck(Farm *this)

{
  bool bVar1;
  ostream *poVar2;
  double capacity;
  string plate;
  allocator local_c9;
  string local_c8;
  double local_a8;
  double local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  string local_78;
  string local_58;
  undefined1 local_38 [40];
  
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  std::operator<<((ostream *)&std::cout,"Enter new truck\'s plate: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_98);
  std::__cxx11::string::string((string *)&local_58,(string *)&local_98);
  bVar1 = searchTruckByPlate(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_c8,"ERROR: It already exists a truck with the given plate!",
               &local_c9);
    cinERR(&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string((string *)&local_c8,"ENTER to go back",&local_c9);
    enterWait(&local_c8);
  }
  else {
    std::__cxx11::string::string((string *)&local_c8,"Enter truck\'s capacity: ",&local_c9);
    getDouble(&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    local_a8 = local_a0;
    std::__cxx11::string::string((string *)&local_78,(string *)&local_98);
    Truck::Truck((Truck *)local_38,local_a8,&local_78);
    std::vector<Truck,_std::allocator<Truck>_>::push_back(&this->trucks,(value_type *)local_38);
    std::__cxx11::string::~string((string *)(local_38 + 8));
    std::__cxx11::string::~string((string *)&local_78);
    this->farmFileChanged = true;
    poVar2 = std::operator<<((ostream *)&std::cout,"Truck successfully created!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string((string *)&local_c8,"ENTER to go back",&local_c9);
    enterWait(&local_c8);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void Farm::createTruck() {
    string plate;
    double capacity;

    cout << "Enter new truck's plate: ";
    getline(cin, plate);
    if(searchTruckByPlate(plate)){
        cinERR("ERROR: It already exists a truck with the given plate!");
        enterWait();
        return;
    }

    getDouble(capacity, "Enter truck's capacity: ");

    addTruck(Truck(capacity, plate));

    farmFileChanged = true;
    cout << "Truck successfully created!" << endl;
    enterWait();
}